

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.c
# Opt level: O0

int filter_special(double fp,char *dest)

{
  uint64_t uVar1;
  undefined1 *in_RDI;
  double in_XMM0_Qa;
  _Bool nan;
  uint64_t bits;
  int local_4;
  
  if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    uVar1 = get_dbits(in_XMM0_Qa);
    if ((uVar1 & 0x7ff0000000000000) == 0x7ff0000000000000) {
      if ((uVar1 & 0xfffffffffffff) == 0) {
        *in_RDI = 0x69;
        in_RDI[1] = 0x6e;
        in_RDI[2] = 0x66;
      }
      else {
        *in_RDI = 0x6e;
        in_RDI[1] = 0x61;
        in_RDI[2] = 0x6e;
      }
      local_4 = 3;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    *in_RDI = 0x30;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int filter_special(double fp, char* dest)
{
    if(fp == 0.0) {
        dest[0] = '0';
        return 1;
    }

    uint64_t bits = get_dbits(fp);

    bool nan = (bits & expmask) == expmask;

    if(!nan) {
        return 0;
    }

    if(bits & fracmask) {
        dest[0] = 'n'; dest[1] = 'a'; dest[2] = 'n';

    } else {
        dest[0] = 'i'; dest[1] = 'n'; dest[2] = 'f';
    }

    return 3;
}